

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::CodeGeneratorResponse_File
          (CodeGeneratorResponse_File *this,CodeGeneratorResponse_File *from)

{
  bool bVar1;
  string *psVar2;
  Arena *pAVar3;
  GeneratedCodeInfo *this_00;
  CodeGeneratorResponse_File *from_local;
  CodeGeneratorResponse_File *this_local;
  
  Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__CodeGeneratorResponse_File_008e6990;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  internal::CachedSize::CachedSize(&this->_cached_size_);
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_,
             &(from->super_Message).super_MessageLite._internal_metadata_);
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault(&this->name_,psVar2);
  bVar1 = _internal_has_name(from);
  if (bVar1) {
    psVar2 = _internal_name_abi_cxx11_(from);
    pAVar3 = MessageLite::GetArenaForAllocation((MessageLite *)this);
    internal::ArenaStringPtr::Set(&this->name_,psVar2,pAVar3);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault(&this->insertion_point_,psVar2);
  bVar1 = _internal_has_insertion_point(from);
  if (bVar1) {
    psVar2 = _internal_insertion_point_abi_cxx11_(from);
    pAVar3 = MessageLite::GetArenaForAllocation((MessageLite *)this);
    internal::ArenaStringPtr::Set(&this->insertion_point_,psVar2,pAVar3);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault(&this->content_,psVar2);
  bVar1 = _internal_has_content(from);
  if (bVar1) {
    psVar2 = _internal_content_abi_cxx11_(from);
    pAVar3 = MessageLite::GetArenaForAllocation((MessageLite *)this);
    internal::ArenaStringPtr::Set(&this->content_,psVar2,pAVar3);
  }
  bVar1 = _internal_has_generated_code_info(from);
  if (bVar1) {
    this_00 = (GeneratedCodeInfo *)operator_new(0x30);
    GeneratedCodeInfo::GeneratedCodeInfo(this_00,from->generated_code_info_);
    this->generated_code_info_ = this_00;
  }
  else {
    this->generated_code_info_ = (GeneratedCodeInfo *)0x0;
  }
  return;
}

Assistant:

CodeGeneratorResponse_File::CodeGeneratorResponse_File(const CodeGeneratorResponse_File& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _has_bits_(from._has_bits_) {
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (from._internal_has_name()) {
    name_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_name(), 
      GetArenaForAllocation());
  }
  insertion_point_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    insertion_point_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (from._internal_has_insertion_point()) {
    insertion_point_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_insertion_point(), 
      GetArenaForAllocation());
  }
  content_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    content_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (from._internal_has_content()) {
    content_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_content(), 
      GetArenaForAllocation());
  }
  if (from._internal_has_generated_code_info()) {
    generated_code_info_ = new ::PROTOBUF_NAMESPACE_ID::GeneratedCodeInfo(*from.generated_code_info_);
  } else {
    generated_code_info_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:google.protobuf.compiler.CodeGeneratorResponse.File)
}